

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O0

vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
* __thiscall
google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator::operator()
          (vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
           *__return_storage_ptr__,DepsGenerator *this,Descriptor *desc)

{
  int iVar1;
  int iVar2;
  FieldDescriptor *pFVar3;
  Descriptor *pDVar4;
  Descriptor *local_40 [3];
  int local_28;
  undefined1 local_21;
  int i;
  Descriptor *desc_local;
  DepsGenerator *this_local;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  *deps;
  
  local_21 = 0;
  _i = desc;
  desc_local = (Descriptor *)this;
  this_local = (DepsGenerator *)__return_storage_ptr__;
  std::
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::vector(__return_storage_ptr__);
  for (local_28 = 0; iVar1 = local_28, iVar2 = Descriptor::field_count(_i), iVar1 < iVar2;
      local_28 = local_28 + 1) {
    pFVar3 = Descriptor::field(_i,local_28);
    pDVar4 = FieldDescriptor::message_type(pFVar3);
    if (pDVar4 != (Descriptor *)0x0) {
      pFVar3 = Descriptor::field(_i,local_28);
      local_40[0] = FieldDescriptor::message_type(pFVar3);
      std::
      vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ::push_back(__return_storage_ptr__,local_40);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const Descriptor*> operator()(const Descriptor* desc) const {
      std::vector<const Descriptor*> deps;
      for (int i = 0; i < desc->field_count(); i++) {
        if (desc->field(i)->message_type()) {
          deps.push_back(desc->field(i)->message_type());
        }
      }
      return deps;
    }